

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearrayview.h
# Opt level: O2

int __thiscall QByteArrayView::toInt(QByteArrayView *this,bool *ok,int base)

{
  bool bVar1;
  int iVar2;
  int in_R8D;
  long in_FS_OFFSET;
  bool bVar3;
  QByteArrayView data;
  undefined1 local_38 [16];
  undefined1 *local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  data.m_data._0_4_ = base;
  data.m_size = (qsizetype)this->m_data;
  data.m_data._4_4_ = 0;
  QtPrivate::toSignedInteger
            ((ParsedNumber<long_long> *)local_38,(QtPrivate *)this->m_size,data,in_R8D);
  bVar3 = (local_38._8_8_ & 1) == 0;
  bVar1 = (ulong)(local_38._0_8_ + 0x80000000) >> 0x20 == 0;
  if (ok != (bool *)0x0) {
    *ok = bVar1 && bVar3;
  }
  iVar2 = 0;
  if (bVar1 && bVar3) {
    iVar2 = (int)local_38._0_8_;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

[[nodiscard]] int toInt(bool *ok = nullptr, int base = 10) const
    { return QtPrivate::toIntegral<int>(*this, ok, base); }